

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.h
# Opt level: O3

bool DeploymentActiveAfter<Consensus::BuriedDeployment>
               (CBlockIndex *pindexPrev,ChainstateManager *chainman,BuriedDeployment dep)

{
  int iVar1;
  uint uVar2;
  undefined6 in_register_00000012;
  long in_FS_OFFSET;
  
  uVar2 = (uint)CONCAT62(in_register_00000012,dep);
  if (-0x7ffc < (int)uVar2) {
    __assert_fail("Consensus::ValidDeployment(dep)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/deploymentstatus.h"
                  ,0x10,
                  "bool DeploymentActiveAfter(const CBlockIndex *, const Consensus::Params &, Consensus::BuriedDeployment, VersionBitsCache &)"
                 );
  }
  if (pindexPrev == (CBlockIndex *)0x0) {
    iVar1 = 0;
  }
  else {
    iVar1 = pindexPrev->nHeight + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return *(int *)((((chainman->m_options).chainparams)->consensus).hashGenesisBlock.
                    super_base_blob<256U>.m_data._M_elems +
                   *(long *)(&DAT_00f99100 + (ulong)(uVar2 & 7) * 8)) <= iVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool DeploymentActiveAfter(const CBlockIndex* pindexPrev, const ChainstateManager& chainman, DEP dep)
{
    return DeploymentActiveAfter(pindexPrev, chainman.GetConsensus(), dep, chainman.m_versionbitscache);
}